

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O3

void __thiscall Rml::ElementEffects::InstanceEffects(ElementEffects *this)

{
  PropertyId PVar1;
  RenderManager *pRVar2;
  element_type *peVar3;
  code *pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ComputedValues *pCVar9;
  undefined4 extraout_var;
  Property *pPVar10;
  ElementDocument *this_01;
  DecoratorPtrList *pDVar11;
  long *plVar12;
  pointer psVar13;
  PropertySource *source;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  long lVar16;
  pointer psVar17;
  char *pcVar18;
  long lVar19;
  RenderManager *pRVar20;
  DecoratorEntryList *this_02;
  ulong uVar21;
  RenderManager *this_03;
  DecoratorsPtr decorators_ptr;
  FiltersPtr filters_ptr;
  PropertySource document_source;
  undefined2 local_12a;
  FilterEntryList *local_128;
  undefined1 local_120 [16];
  RenderManager *local_110;
  undefined1 local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  DecoratorDataHandle local_f8;
  BoxArea local_f0;
  undefined1 local_e0 [17];
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  int local_c0;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  ElementEffects *local_98;
  element_type *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  ComputedValues *local_50;
  DecoratorEntryList *local_48;
  DecoratorEntryList *local_40;
  StyleSheet *local_38;
  
  if (this->effects_dirty == true) {
    this->effects_dirty = false;
    this->effects_data_dirty = true;
    ReleaseEffects(this);
    local_110 = Element::GetRenderManager(this->element);
    if (local_110 == (RenderManager *)0x0) {
      bVar6 = Assert("Decorators are being instanced before a render manager is available. Is this element attached to the document?"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                     ,0x3e);
      if (!bVar6) {
LAB_00227af4:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
    }
    else {
      pCVar9 = Element::GetComputedValues(this->element);
      local_98 = this;
      if ((((pCVar9->common).field_0x1 & 0x80) != 0) ||
         (uVar8 = *(uint *)&pCVar9->rare, (uVar8 >> 0x19 & 1) != 0)) {
        iVar7 = (*(this->element->super_ScriptInterface).super_Releasable._vptr_Releasable[4])();
        local_38 = (StyleSheet *)CONCAT44(extraout_var,iVar7);
        if (local_38 == (StyleSheet *)0x0) {
          return;
        }
        local_12a = 0x4d4c;
        lVar14 = 0;
        local_40 = &this->mask_images;
        local_48 = &this->decorators;
        local_50 = pCVar9;
        do {
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_80 + 0x20);
          PVar1 = *(PropertyId *)((long)&local_12a + lVar14);
          pPVar10 = Element::GetLocalProperty(this->element,PVar1);
          if ((pPVar10 != (Property *)0x0) && (pPVar10->unit == DECORATOR)) {
            Property::Get<std::shared_ptr<Rml::DecoratorDeclarationList_const>>
                      ((Property *)local_120);
            if (CONCAT62(local_120._2_6_,local_120._0_2_) != 0) {
              local_128 = (FilterEntryList *)CONCAT71(local_128._1_7_,PVar1);
              local_90 = (element_type *)local_80;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
              local_70 = paVar15;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 0x10),"","");
              local_e0._0_8_ = local_e0 + 0x10;
              if (local_90 == (element_type *)local_80) {
                uStack_c8 = local_80._8_8_;
              }
              else {
                local_e0._0_8_ = local_90;
              }
              uStack_cf = local_80._1_7_;
              local_e0[0x10] = local_80[0];
              local_e0._8_8_ = local_88;
              local_88 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_80[0] = 0;
              local_c0 = 0;
              local_b8._M_p = (pointer)&local_a8;
              if (local_70 == paVar15) {
                local_a8._8_8_ = local_60._8_8_;
              }
              else {
                local_b8._M_p = (pointer)local_70;
              }
              local_a8._M_allocated_capacity._1_7_ = local_60._M_allocated_capacity._1_7_;
              local_a8._M_local_buf[0] = local_60._M_local_buf[0];
              local_b0 = local_68;
              local_68 = 0;
              local_60._M_local_buf[0] = 0;
              source = (pPVar10->source).
                       super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              cVar5 = (char)local_128;
              local_90 = (element_type *)local_80;
              local_70 = paVar15;
              if (source == (element_type *)0x0) {
                this_01 = Element::GetOwnerDocument(this->element);
                if (this_01 == (ElementDocument *)0x0) {
                  source = (PropertySource *)0x0;
                }
                else {
                  ElementDocument::GetSourceURL_abi_cxx11_(this_01);
                  source = (PropertySource *)local_e0;
                  ::std::__cxx11::string::_M_assign((string *)source);
                }
              }
              pDVar11 = StyleSheet::InstanceDecorators
                                  (local_38,local_110,
                                   (DecoratorDeclarationList *)
                                   CONCAT62(local_120._2_6_,local_120._0_2_),source);
              psVar17 = (pDVar11->
                        super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              psVar13 = (pDVar11->
                        super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              plVar12 = (long *)CONCAT62(local_120._2_6_,local_120._0_2_);
              if ((psVar17 != psVar13) &&
                 ((long)psVar13 - (long)psVar17 >> 4 !=
                  (plVar12[1] - *plVar12 >> 5) * -0x5555555555555555)) {
                bVar6 = Assert("RMLUI_ASSERT(decorator_list.empty() || decorator_list.size() == decorators_ptr->list.size())"
                               ,
                               "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                               ,0x61);
                if (!bVar6) goto LAB_00227af4;
                plVar12 = (long *)CONCAT62(local_120._2_6_,local_120._0_2_);
              }
              this_02 = local_40;
              if (cVar5 == 'L') {
                this_02 = local_48;
              }
              ::std::
              vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
              ::reserve(this_02,(plVar12[1] - *plVar12 >> 5) * -0x5555555555555555);
              psVar17 = (pDVar11->
                        super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              psVar13 = (pDVar11->
                        super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              if (psVar13 != psVar17) {
                local_128 = (FilterEntryList *)CONCAT44(local_128._4_4_,(cVar5 == 'L') + 1);
                lVar19 = 8;
                lVar16 = 0x58;
                uVar21 = 0;
                do {
                  if ((ulong)((((long *)CONCAT62(local_120._2_6_,local_120._0_2_))[1] -
                               *(long *)CONCAT62(local_120._2_6_,local_120._0_2_) >> 5) *
                             -0x5555555555555555) <= uVar21) break;
                  if (*(long *)((long)psVar17 + lVar19 + -8) != 0) {
                    _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_f8 = 0;
                    local_108 = *(undefined1 (*) [8])((long)psVar17 + lVar19 + -8);
                    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                              (&_Stack_100,
                               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                               ((long)&(psVar17->
                                       super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar19));
                    local_f0 = *(BoxArea *)
                                (*(long *)CONCAT62(local_120._2_6_,local_120._0_2_) + lVar16);
                    if (local_f0 == Auto) {
                      local_f0 = (BoxArea)local_128;
                    }
                    if ((2 < local_f0 - Border) &&
                       (bVar6 = Assert("RMLUI_ASSERT(entry.paint_area >= BoxArea::Border && entry.paint_area <= BoxArea::Content)"
                                       ,
                                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                                       ,0x72), !bVar6)) goto LAB_00227af4;
                    ::std::
                    vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                    ::emplace_back<Rml::ElementEffects::DecoratorEntry>
                              (this_02,(DecoratorEntry *)local_108);
                    if (_Stack_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (_Stack_100._M_pi);
                    }
                    psVar17 = (pDVar11->
                              super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    psVar13 = (pDVar11->
                              super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish;
                  }
                  uVar21 = uVar21 + 1;
                  lVar19 = lVar19 + 0x10;
                  lVar16 = lVar16 + 0x60;
                } while (uVar21 < (ulong)((long)psVar13 - (long)psVar17 >> 4));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_p != &local_a8) {
                operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
              }
              this = local_98;
              if ((element_type *)local_e0._0_8_ != (element_type *)(local_e0 + 0x10)) {
                operator_delete((void *)local_e0._0_8_,stack0xffffffffffffff30 + 1);
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 2);
        uVar8 = *(uint *)&local_50->rare;
      }
      if ((uVar8 & 0xc000000) != 0) {
        local_120._0_2_ = 0x504f;
        local_128 = &this->backdrop_filters;
        local_110 = (RenderManager *)&this->filters;
        lVar14 = 0;
        do {
          PVar1 = local_120[lVar14];
          pPVar10 = Element::GetLocalProperty(this->element,PVar1);
          if ((pPVar10 != (Property *)0x0) && (pPVar10->unit == FILTER)) {
            Property::Get<std::shared_ptr<Rml::FilterDeclarationList_const>>((Property *)local_108);
            if (local_108 != (undefined1  [8])0x0) {
              this_03 = (RenderManager *)local_128;
              if (PVar1 == Filter) {
                this_03 = local_110;
              }
              ::std::
              vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
              ::reserve((vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                         *)this_03,
                        ((long)((Texture *)((long)local_108 + 8))->render_manager -
                         (long)*(_func_int ***)local_108 >> 3) * 0x2e8ba2e8ba2e8ba3);
              pRVar2 = ((Texture *)((long)local_108 + 8))->render_manager;
              for (pRVar20 = (RenderManager *)*(_func_int ***)local_108; pRVar20 != pRVar2;
                  pRVar20 = (RenderManager *)&pRVar20->state) {
                plVar12 = (long *)(pRVar20->geometry_list).free_slots.
                                  super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                (**(code **)(*plVar12 + 0x10))
                          (local_e0,plVar12,pRVar20,
                           &(pRVar20->geometry_list).free_slots.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
                this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_;
                if ((element_type *)local_e0._0_8_ == (element_type *)0x0) {
                  peVar3 = (pPVar10->source).
                           super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  if (peVar3 == (element_type *)0x0) {
                    uVar21 = 0xffffffff;
                    pcVar18 = "";
                  }
                  else {
                    pcVar18 = (peVar3->path)._M_dataplus._M_p;
                    uVar21 = (ulong)(uint)peVar3->line_number;
                  }
                  Log::Message(LT_WARNING,
                               "Filter \'%s\' in \'%s\' could not be instanced, declared at %s:%d",
                               pRVar20->render_interface,
                               (((Vector<Texture> *)((long)local_108 + 0x18))->
                               super__Vector_base<Rml::Texture,_std::allocator<Rml::Texture>_>).
                               _M_impl.super__Vector_impl_data._M_start,pcVar18,uVar21);
                }
                else {
                  stack0xffffffffffffff30 = 0;
                  uStack_c8 = 0;
                  ::std::
                  vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                  ::emplace_back<Rml::ElementEffects::FilterEntry>
                            ((vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                              *)this_03,(FilterEntry *)local_e0);
                  CompiledFilter::Release((CompiledFilter *)(local_e0 + 0x10));
                  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_;
                }
                if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                }
              }
            }
            this = local_98;
            if (_Stack_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
              this = local_98;
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 2);
      }
    }
  }
  return;
}

Assistant:

void ElementEffects::InstanceEffects()
{
	if (!effects_dirty)
		return;

	effects_dirty = false;
	effects_data_dirty = true;

	RMLUI_ZoneScopedC(0xB22222);
	ReleaseEffects();

	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
	{
		RMLUI_ERRORMSG("Decorators are being instanced before a render manager is available. Is this element attached to the document?");
		return;
	}

	const ComputedValues& computed = element->GetComputedValues();

	if (computed.has_decorator() || computed.has_mask_image())
	{
		const StyleSheet* style_sheet = element->GetStyleSheet();
		if (!style_sheet)
			return;

		for (const auto id : {PropertyId::Decorator, PropertyId::MaskImage})
		{
			const Property* property = element->GetLocalProperty(id);
			if (!property || property->unit != Unit::DECORATOR)
				continue;

			DecoratorsPtr decorators_ptr = property->Get<DecoratorsPtr>();
			if (!decorators_ptr)
				continue;

			PropertySource document_source("", 0, "");
			const PropertySource* source = property->source.get();

			if (!source)
			{
				if (ElementDocument* document = element->GetOwnerDocument())
				{
					document_source.path = document->GetSourceURL();
					source = &document_source;
				}
			}

			const DecoratorPtrList& decorator_list = style_sheet->InstanceDecorators(*render_manager, *decorators_ptr, source);
			RMLUI_ASSERT(decorator_list.empty() || decorator_list.size() == decorators_ptr->list.size());

			DecoratorEntryList& decorators_target = (id == PropertyId::Decorator ? decorators : mask_images);
			decorators_target.reserve(decorators_ptr->list.size());

			for (size_t i = 0; i < decorator_list.size() && i < decorators_ptr->list.size(); i++)
			{
				const SharedPtr<const Decorator>& decorator = decorator_list[i];
				if (decorator)
				{
					DecoratorEntry entry;
					entry.decorator_data = 0;
					entry.decorator = decorator;
					entry.paint_area = decorators_ptr->list[i].paint_area;
					if (entry.paint_area == BoxArea::Auto)
						entry.paint_area = (id == PropertyId::Decorator ? BoxArea::Padding : BoxArea::Border);

					RMLUI_ASSERT(entry.paint_area >= BoxArea::Border && entry.paint_area <= BoxArea::Content);
					decorators_target.push_back(std::move(entry));
				}
			}
		}
	}

	if (computed.has_filter() || computed.has_backdrop_filter())
	{
		for (const auto id : {PropertyId::Filter, PropertyId::BackdropFilter})
		{
			const Property* property = element->GetLocalProperty(id);
			if (!property || property->unit != Unit::FILTER)
				continue;

			FiltersPtr filters_ptr = property->Get<FiltersPtr>();
			if (!filters_ptr)
				continue;

			FilterEntryList& list = (id == PropertyId::Filter ? filters : backdrop_filters);
			list.reserve(filters_ptr->list.size());

			for (const FilterDeclaration& declaration : filters_ptr->list)
			{
				SharedPtr<const Filter> filter = declaration.instancer->InstanceFilter(declaration.type, declaration.properties);
				if (filter)
				{
					list.push_back({std::move(filter), CompiledFilter{}});
				}
				else
				{
					const auto& source = property->source;
					Log::Message(Log::LT_WARNING, "Filter '%s' in '%s' could not be instanced, declared at %s:%d", declaration.type.c_str(),
						filters_ptr->value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
				}
			}
		}
	}
}